

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkbox.cpp
# Opt level: O0

int checkbox_width_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  char *pcVar6;
  Am_Drawonable *pAVar7;
  char *__s;
  size_t sVar8;
  undefined1 local_8c [4];
  int obj_width;
  int b;
  int a;
  int descent;
  int ascent;
  int str_width;
  Am_Drawonable *local_70;
  Am_Drawonable *draw;
  Am_Font font;
  Am_Object window;
  int offset;
  undefined1 local_48 [4];
  int box_width;
  Am_Value value;
  Am_Object local_28;
  Am_Object obj;
  Am_String string;
  Am_Object *self_local;
  
  Am_String::Am_String((Am_String *)&obj);
  Am_Object::Am_Object(&local_28);
  Am_Value::Am_Value((Am_Value *)local_48);
  pAVar5 = Am_Object::Get(self,0x188,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Peek(self,0x1ae,0);
  Am_Value::operator=((Am_Value *)local_48,pAVar5);
  if (local_48._0_2_ == 0x8008) {
    Am_String::operator=((Am_String *)&obj,(Am_Value *)local_48);
  }
  else {
    if (local_48._0_2_ != 0xa001) {
      self_local._4_4_ = iVar2 + 0x14;
      goto LAB_0035c30e;
    }
    Am_Object::operator=(&local_28,(Am_Value *)local_48);
  }
  pAVar5 = Am_Object::Get(self,0x17e,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  pcVar6 = Am_String::operator_cast_to_char_((Am_String *)&obj);
  if (pcVar6 == (char *)0x0) {
    bVar1 = Am_Object::Valid(&local_28);
    if (bVar1) {
      pAVar5 = Am_Object::Get(&local_28,0x66,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar5);
      self_local._4_4_ = iVar2 + iVar4 + 8 + iVar3 * 2;
      goto LAB_0035c30e;
    }
  }
  else {
    Am_Object::Am_Object((Am_Object *)&font);
    Am_Font::Am_Font((Am_Font *)&draw,Am_FONT_FIXED,false,false,false,Am_FONT_MEDIUM);
    pAVar5 = Am_Object::Get(self,0x68,0);
    Am_Object::operator=((Am_Object *)&font,pAVar5);
    pAVar5 = Am_Object::Get(self,0xac,0);
    Am_Font::operator=((Am_Font *)&draw,pAVar5);
    Am_Object::Am_Object((Am_Object *)&ascent,(Am_Object *)&font);
    pAVar7 = GV_a_drawonable((Am_Object *)&ascent);
    Am_Object::~Am_Object((Am_Object *)&ascent);
    local_70 = pAVar7;
    if (pAVar7 != (Am_Drawonable *)0x0) {
      pcVar6 = Am_String::operator_cast_to_char_((Am_String *)&obj);
      __s = Am_String::operator_cast_to_char_((Am_String *)&obj);
      sVar8 = strlen(__s);
      (*pAVar7->_vptr_Am_Drawonable[0x1a])
                (pAVar7,&draw,pcVar6,sVar8 & 0xffffffff,&descent,&a,&b,&obj_width,local_8c);
      self_local._4_4_ = iVar2 + descent + 8 + iVar3 * 2;
    }
    Am_Font::~Am_Font((Am_Font *)&draw);
    Am_Object::~Am_Object((Am_Object *)&font);
    if (pAVar7 != (Am_Drawonable *)0x0) goto LAB_0035c30e;
  }
  self_local._4_4_ = iVar2 + 0x14;
LAB_0035c30e:
  Am_Value::~Am_Value((Am_Value *)local_48);
  Am_Object::~Am_Object(&local_28);
  Am_String::~Am_String((Am_String *)&obj);
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, checkbox_width)
{
  Am_String string;
  Am_Object obj;
  Am_Value value;
  // string slot contains a formula which gets the real object based on the
  // value of the COMMAND slot
  int box_width = self.Get(Am_BOX_WIDTH);
  value = self.Peek(Am_REAL_STRING_OR_OBJ);
  if (value.type == Am_STRING)
    string = value;
  else if (value.type == Am_OBJECT)
    obj = value;
  else
    return 20 + box_width;

  int offset = self.Get(Am_ITEM_OFFSET);

  if ((const char *)string) {
    Am_Object window;
    Am_Font font;
    window = self.Get(Am_WINDOW);
    font = self.Get(Am_FONT);
    //GV_a_drawonable will work if not window valid
    Am_Drawonable *draw = GV_a_drawonable(window);
    if (draw) {
      int str_width, ascent, descent, a, b;
      draw->Get_String_Extents(font, string, strlen(string), str_width, ascent,
                               descent, a, b);
      return box_width + str_width + 8 + 2 * offset;
    }
  } else if (obj.Valid()) {
    int obj_width = obj.Get(Am_WIDTH);
    return box_width + obj_width + 8 + 2 * offset;
  }

  return 20 + box_width;
}